

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void __thiscall woff2::anon_unknown_2::GlyfEncoder::~GlyfEncoder(GlyfEncoder *this)

{
  GlyfEncoder *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->instruction_stream_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->glyph_stream_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->bbox_stream_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->bbox_bitmap_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->composite_stream_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->flag_byte_stream_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->n_points_stream_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->n_contour_stream_);
  return;
}

Assistant:

explicit GlyfEncoder(int num_glyphs)
      : n_glyphs_(num_glyphs) {
    bbox_bitmap_.resize(((num_glyphs + 31) >> 5) << 2);
  }